

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O3

void av1_cdef_frame_mt(AV1_COMMON *cm,MACROBLOCKD *xd,AV1CdefWorkerData *cdef_worker,
                      AVxWorker *workers,AV1CdefSync *cdef_sync,int num_workers,
                      cdef_init_fb_row_t cdef_init_fb_row_fn,int do_extend_border)

{
  ulong uVar1;
  uint8_t uVar2;
  AVxWorker *pAVar3;
  int iVar4;
  AVxWorkerInterface *pAVar5;
  uint16_t **ppuVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  AVxWorker *worker;
  AVxWorker *pAVar12;
  bool bVar13;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  bVar13 = cm->seq_params->monochrome == '\0';
  lVar7 = 0;
  av1_setup_dst_planes
            (xd->plane,cm->seq_params->sb_size,&cm->cur_frame->buf,0,0,0,bVar13 + 1 + (uint)bVar13);
  *(undefined8 *)((long)&cdef_sync->fbr + 1) = 0;
  cdef_sync->end_of_frame = 0;
  cdef_sync->fbr = 0;
  uVar2 = cm->seq_params->monochrome;
  cdef_worker->srcbuf = (cm->cdef_info).srcbuf;
  lVar11 = (ulong)(uVar2 == '\0') * 2 + 1;
  do {
    cdef_worker->colbuf[lVar7] = (cm->cdef_info).colbuf[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar11 != lVar7);
  uVar8 = (ulong)(uint)num_workers;
  if (num_workers < 1) {
    aom_get_worker_interface();
  }
  else {
    ppuVar6 = cdef_worker[uVar8 - 1].linebuf;
    uVar9 = uVar8;
    do {
      uVar1 = uVar9 - 1;
      cdef_worker[uVar1].cm = cm;
      cdef_worker[uVar1].xd = xd;
      cdef_worker[uVar1].cdef_init_fb_row_fn = cdef_init_fb_row_fn;
      cdef_worker[uVar1].do_extend_border = do_extend_border;
      lVar7 = 0;
      do {
        ppuVar6[lVar7] = (cm->cdef_info).linebuf[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar11 != lVar7);
      workers[uVar1].hook = cdef_sb_row_worker_hook;
      workers[uVar1].data1 = cdef_sync;
      workers[uVar1].data2 = cdef_worker + uVar1;
      ppuVar6 = ppuVar6 + -0x3f;
      bVar13 = 1 < (long)uVar9;
      uVar9 = uVar1;
    } while (bVar13);
    pAVar5 = aom_get_worker_interface();
    lVar11 = uVar8 - 1;
    pAVar12 = workers + lVar11;
    workers[lVar11].had_error = 0;
    pAVar3 = pAVar12;
    for (; lVar11 != 0; lVar11 = lVar11 + -1) {
      (*pAVar5->launch)(pAVar12);
      pAVar12[-1].had_error = 0;
      pAVar12 = pAVar12 + -1;
      pAVar3 = workers;
    }
    (*pAVar5->execute)(pAVar3);
  }
  pAVar5 = aom_get_worker_interface();
  iVar10 = workers->had_error;
  if (iVar10 != 0) {
    memcpy(&local_1d0,(void *)((long)workers->data2 + 0x58),0x1a0);
  }
  if (1 < num_workers) {
    uVar9 = uVar8 + 1;
    pAVar12 = workers + uVar8;
    do {
      iVar4 = (*pAVar5->sync)(pAVar12 + -1);
      if (iVar4 == 0) {
        memcpy(&local_1d0,(void *)((long)pAVar12[-1].data2 + 0x58),0x1a0);
        iVar10 = 1;
      }
      uVar9 = uVar9 - 1;
      pAVar12 = pAVar12 + -1;
    } while (2 < uVar9);
  }
  if (iVar10 != 0) {
    aom_internal_error_copy(cm->error,&local_1d0);
  }
  return;
}

Assistant:

void av1_cdef_frame_mt(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                       AV1CdefWorkerData *const cdef_worker,
                       AVxWorker *const workers, AV1CdefSync *const cdef_sync,
                       int num_workers, cdef_init_fb_row_t cdef_init_fb_row_fn,
                       int do_extend_border) {
  YV12_BUFFER_CONFIG *frame = &cm->cur_frame->buf;
  const int num_planes = av1_num_planes(cm);

  av1_setup_dst_planes(xd->plane, cm->seq_params->sb_size, frame, 0, 0, 0,
                       num_planes);

  reset_cdef_job_info(cdef_sync);
  prepare_cdef_frame_workers(cm, xd, cdef_worker, cdef_sb_row_worker_hook,
                             workers, cdef_sync, num_workers,
                             cdef_init_fb_row_fn, do_extend_border);
  launch_cdef_workers(workers, num_workers);
  sync_cdef_workers(workers, cm, num_workers);
}